

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::grow
          (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *this,size_t MinSize)

{
  long *plVar1;
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *pSVar2;
  long *plVar3;
  undefined8 uVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *pSVar10;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar5 = (ulong)(this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar8 = uVar5 >> 1 | uVar5;
  uVar8 = uVar8 >> 2 | uVar8;
  uVar8 = uVar8 >> 4 | uVar8;
  uVar8 = uVar8 >> 8 | uVar8;
  uVar5 = (uVar5 >> 0x20 | uVar8 >> 0x10 | uVar8) + 1;
  if (uVar5 <= MinSize) {
    uVar5 = MinSize;
  }
  if (0xfffffffe < uVar5) {
    uVar5 = 0xffffffff;
  }
  pvVar6 = malloc(uVar5 << 5);
  if (pvVar6 == (void *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  pSVar10 = (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
            (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
            super_SmallVectorBase.BeginX;
  uVar8 = (ulong)(this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                 super_SmallVectorBase.Size;
  if (uVar8 != 0) {
    puVar9 = (undefined8 *)((long)pvVar6 + 0x10);
    lVar7 = uVar8 << 5;
    pSVar10 = pSVar10 + 1;
    do {
      puVar9[-2] = puVar9;
      pSVar2 = (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
               pSVar10[-1].super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
               super_SmallVectorBase.BeginX;
      if (pSVar10 == pSVar2) {
        uVar4 = *(undefined8 *)
                 &(pSVar10->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                  super_SmallVectorBase.Size;
        *puVar9 = (pSVar10->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                  super_SmallVectorBase.BeginX;
        puVar9[1] = uVar4;
      }
      else {
        puVar9[-2] = pSVar2;
        *puVar9 = (pSVar10->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                  super_SmallVectorBase.BeginX;
      }
      puVar9[-1] = *(undefined8 *)
                    &pSVar10[-1].
                     super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                     super_SmallVectorBase.Size;
      pSVar10[-1].super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
      super_SmallVectorBase.BeginX = pSVar10;
      pSVar10[-1].super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
      super_SmallVectorBase.Size = 0;
      pSVar10[-1].super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
      super_SmallVectorBase.Capacity = 0;
      *(undefined1 *)
       &(pSVar10->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
        super_SmallVectorBase.BeginX = 0;
      puVar9 = puVar9 + 4;
      pSVar10 = pSVar10 + 2;
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != 0);
    pSVar10 = (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
              (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
              super_SmallVectorBase.BeginX;
    uVar8 = (ulong)(this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                   super_SmallVectorBase.Size;
    if (uVar8 != 0) {
      lVar7 = uVar8 << 5;
      do {
        plVar1 = (long *)((long)&pSVar10[-1].
                                 super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>
                                 .super_SmallVectorBase.BeginX + lVar7);
        plVar3 = *(long **)((long)&pSVar10[-2].
                                   super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>
                                   .super_SmallVectorBase.BeginX + lVar7);
        if (plVar1 != plVar3) {
          operator_delete(plVar3,*plVar1 + 1);
        }
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != 0);
      pSVar10 = (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
                (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                super_SmallVectorBase.BeginX;
    }
  }
  if (pSVar10 != this + 1) {
    free(pSVar10);
  }
  (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
  super_SmallVectorBase.BeginX = pvVar6;
  (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
  super_SmallVectorBase.Capacity = (uint)uVar5;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}